

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

int fy_atom_iter_utf8_get(fy_atom_iter *iter)

{
  uint uVar1;
  uint in_EAX;
  ssize_t sVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *p;
  int left;
  uint8_t buf [4];
  int w;
  undefined4 local_28;
  int local_24;
  
  uVar4 = 0xffffffff;
  uVar5 = uVar4;
  if (iter != (fy_atom_iter *)0x0) {
    uVar1 = iter->unget_c;
    if (uVar1 == 0xffffffff) {
      local_28 = in_EAX;
      sVar2 = fy_atom_iter_read(iter,&local_28,1);
      if (sVar2 == 1) {
        uVar5 = local_28 & 0xff;
        if (((char)local_28 < '\0') &&
           (((left = 2, (local_28 & 0xe0) == 0xc0 || (left = 3, (local_28 & 0xf0) == 0xe0)) ||
            (left = 4, uVar5 = uVar4, (local_28 & 0xf8) == 0xf0)))) {
          _local_28 = CONCAT44(left,local_28);
          uVar3 = fy_atom_iter_read(iter,(void *)((long)&local_28 + 1),(ulong)(left - 1));
          uVar5 = uVar4;
          if (uVar3 == left - 1) {
            uVar5 = (uint)(char)local_28;
            if ((char)local_28 < '\0') {
              uVar5 = fy_utf8_get_generic(&local_28,left,&local_24);
            }
          }
        }
      }
    }
    else {
      iter->unget_c = -1;
      uVar5 = uVar1 & 0xff;
    }
  }
  return uVar5;
}

Assistant:

int fy_atom_iter_utf8_get(struct fy_atom_iter *iter) {
    uint8_t buf[4];    /* maximum utf8 is 4 octets */
    ssize_t nread;
    int c, w;

    if (!iter)
        return -1;

    /* first try the pushed ungetc */
    if (iter->unget_c != -1) {
        c = iter->unget_c;
        iter->unget_c = -1;
        return c & 0xff;
    }

    /* read first octet */
    nread = fy_atom_iter_read(iter, &buf[0], 1);
    if (nread != 1)
        return -1;

    /* get width from it (0 means illegal) */
    w = fy_utf8_width_by_first_octet(buf[0]);
    if (!w)
        return -1;

    /* read the rest octets (if possible) */
    if (w > 1) {
        nread = fy_atom_iter_read(iter, buf + 1, w - 1);
        if (nread != (w - 1))
            return -1;
    }

    /* and return the decoded utf8 character */
    return fy_utf8_get(buf, w, &w);
}